

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::Clipper::FixupFirstLefts2(Clipper *this,OutRec *InnerOutRec,OutRec *OuterOutRec)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  OutRec *pOVar3;
  OutRec *pOVar4;
  OutPt *pOVar5;
  OutRec *pOVar6;
  OutPt *pOVar7;
  int iVar8;
  long lVar9;
  OutRec *pOVar10;
  ulong uVar11;
  OutPt *op;
  OutPt *pOVar12;
  byte unaff_R15B;
  byte bVar13;
  
  pp_Var1 = this->_vptr_Clipper;
  p_Var2 = pp_Var1[-3];
  lVar9 = *(long *)((long)&this->m_ClipType + (long)p_Var2);
  if (*(long *)(p_Var2 + (long)&(this->m_Maxima).
                                super__List_base<long_long,_std::allocator<long_long>_>) == lVar9) {
    return;
  }
  pOVar3 = OuterOutRec->FirstLeft;
  uVar11 = 0;
LAB_00113ca2:
  pOVar4 = *(OutRec **)(lVar9 + uVar11 * 8);
  if (((pOVar4 != InnerOutRec) && (pOVar4 != OuterOutRec)) &&
     (pOVar5 = pOVar4->Pts, pOVar5 != (OutPt *)0x0)) {
    pOVar6 = pOVar4->FirstLeft;
    for (pOVar10 = pOVar6; (pOVar10 != (OutRec *)0x0 && (pOVar10->Pts == (OutPt *)0x0));
        pOVar10 = pOVar10->FirstLeft) {
    }
    if (((pOVar10 != OuterOutRec) && (pOVar10 != pOVar3)) && (pOVar10 != InnerOutRec))
    goto LAB_00113d99;
    pOVar7 = InnerOutRec->Pts;
    pOVar12 = pOVar5;
    bVar13 = unaff_R15B;
    do {
      iVar8 = PointInPolygon(&pOVar12->Pt,pOVar7);
      unaff_R15B = iVar8 != 0;
      if (iVar8 < 0) {
        pOVar12 = pOVar12->Next;
        unaff_R15B = bVar13;
      }
      pOVar10 = InnerOutRec;
      if (-1 < iVar8) {
        if ((unaff_R15B & 1) == 0) {
          pOVar7 = OuterOutRec->Pts;
          pOVar12 = pOVar5;
          goto LAB_00113d5b;
        }
        break;
      }
      bVar13 = unaff_R15B;
    } while (pOVar12 != pOVar5);
    goto LAB_00113d95;
  }
  goto LAB_00113d99;
  while (pOVar10 = OuterOutRec, pOVar12 != pOVar5) {
LAB_00113d5b:
    iVar8 = PointInPolygon(&pOVar12->Pt,pOVar7);
    bVar13 = iVar8 != 0;
    if (iVar8 < 0) {
      pOVar12 = pOVar12->Next;
      bVar13 = unaff_R15B;
    }
    unaff_R15B = bVar13;
    if (-1 < iVar8) {
      pOVar10 = OuterOutRec;
      if (((unaff_R15B & 1) == 0) &&
         (pOVar10 = pOVar3, pOVar6 != InnerOutRec && pOVar6 != OuterOutRec)) goto LAB_00113d99;
      break;
    }
  }
LAB_00113d95:
  pOVar4->FirstLeft = pOVar10;
LAB_00113d99:
  uVar11 = uVar11 + 1;
  p_Var2 = pp_Var1[-3];
  lVar9 = *(long *)((long)&this->m_ClipType + (long)p_Var2);
  if ((ulong)(*(long *)(p_Var2 + (long)&(this->m_Maxima).
                                        super__List_base<long_long,_std::allocator<long_long>_>) -
              lVar9 >> 3) <= uVar11) {
    return;
  }
  goto LAB_00113ca2;
}

Assistant:

void Clipper::FixupFirstLefts2(OutRec* InnerOutRec, OutRec* OuterOutRec)
{
  //A polygon has split into two such that one is now the inner of the other.
  //It's possible that these polygons now wrap around other polygons, so check
  //every polygon that's also contained by OuterOutRec's FirstLeft container
  //(including 0) to see if they've become inner to the new inner polygon ...
  OutRec* orfl = OuterOutRec->FirstLeft;
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];

    if (!outRec->Pts || outRec == OuterOutRec || outRec == InnerOutRec)
      continue;
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (firstLeft != orfl && firstLeft != InnerOutRec && firstLeft != OuterOutRec)
      continue;
    if (Poly2ContainsPoly1(outRec->Pts, InnerOutRec->Pts))
      outRec->FirstLeft = InnerOutRec;
    else if (Poly2ContainsPoly1(outRec->Pts, OuterOutRec->Pts))
      outRec->FirstLeft = OuterOutRec;
    else if (outRec->FirstLeft == InnerOutRec || outRec->FirstLeft == OuterOutRec)
      outRec->FirstLeft = orfl;
  }
}